

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::TypeManager::AttachDecorations(TypeManager *this,uint32_t id,Type *type)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  void *pvVar2;
  undefined4 element;
  int iVar3;
  undefined4 extraout_var;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vec_1;
  undefined1 local_78 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_68;
  _Rb_tree_node_base *local_58;
  _Rb_tree_node_base *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  long lVar4;
  
  pvVar1 = (type->decorations_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar5 = (type->decorations_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar5 != pvVar1; pvVar5 = pvVar5 + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,pvVar5);
    CreateDecoration(this,id,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,false,0
                    );
    pvVar2 = (void *)CONCAT44(local_78._4_4_,local_78._0_4_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)local_68 - (long)pvVar2);
    }
  }
  iVar3 = (*type->_vptr_Type[0x1c])(type);
  lVar4 = CONCAT44(extraout_var,iVar3);
  if (lVar4 != 0) {
    local_50 = *(_Rb_tree_node_base **)(lVar4 + 0x58);
    local_58 = (_Rb_tree_node_base *)(lVar4 + 0x48);
    if (local_50 != local_58) {
      do {
        local_78._0_4_ = local_50[1]._M_color;
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)(local_78 + 8),
                 (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)&local_50[1]._M_parent);
        pvVar1 = local_68;
        element = local_78._0_4_;
        for (pvVar5 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78._8_8_;
            pvVar5 != pvVar1; pvVar5 = pvVar5 + 1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,pvVar5);
          CreateDecoration(this,id,&local_48,true,element);
          if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)(local_78 + 8));
        local_50 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_50);
      } while (local_50 != local_58);
    }
  }
  return;
}

Assistant:

void TypeManager::AttachDecorations(uint32_t id, const Type* type) {
  for (auto vec : type->decorations()) {
    CreateDecoration(id, vec);
  }
  if (const Struct* structTy = type->AsStruct()) {
    for (auto pair : structTy->element_decorations()) {
      uint32_t element = pair.first;
      for (auto vec : pair.second) {
        CreateDecoration(id, vec, /* is_member */ true, element);
      }
    }
  }
}